

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

ChangeInfo *
capnp::compiler::anon_unknown_0::structAddField
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  Builder params;
  Builder BVar1;
  undefined1 auVar2 [32];
  Builder type;
  int iVar3;
  ChangeInfo *this;
  ArrayPtr<const_char> local_220;
  Builder local_208;
  Builder local_1e0;
  Builder local_1b8;
  Builder local_190;
  undefined1 local_168 [8];
  ConstFunction<void_(capnp::compiler::Expression::Builder)> makeValue;
  Builder field;
  Builder local_108;
  String local_d0;
  ArrayPtr<const_char> local_b8;
  Builder local_a8;
  uint local_7c;
  SegmentBuilder *pSStack_78;
  uint ordinal;
  CapTableBuilder *pCStack_70;
  void *local_68;
  WirePointer *pWStack_60;
  StructDataBitCount local_58;
  StructPointerCount SStack_54;
  undefined2 uStack_52;
  undefined1 local_48 [8];
  Builder fieldDecl;
  bool scopeHasUnion_local;
  uint *nextOrdinal_local;
  
  BVar1._builder = decl._builder;
  local_58 = decl._builder.dataSize;
  SStack_54 = decl._builder.pointerCount;
  uStack_52 = decl._builder._38_2_;
  local_68 = decl._builder.data;
  pWStack_60 = decl._builder.pointers;
  pSStack_78 = decl._builder.segment;
  pCStack_70 = decl._builder.capTable;
  auVar2 = BVar1._builder._8_32_;
  BVar1._builder._32_8_ = __return_storage_ptr__;
  BVar1._builder.segment = (SegmentBuilder *)auVar2._0_8_;
  BVar1._builder.capTable = (CapTableBuilder *)auVar2._8_8_;
  BVar1._builder.data = (void *)auVar2._16_8_;
  BVar1._builder.pointers = (WirePointer *)auVar2._24_8_;
  this = __return_storage_ptr__;
  fieldDecl._builder._39_1_ = scopeHasUnion;
  addNested(BVar1);
  local_7c = *nextOrdinal;
  *nextOrdinal = local_7c + 1;
  Declaration::Builder::initName(&local_a8,(Builder *)local_48);
  kj::str<char_const(&)[2],unsigned_int&>
            (&local_d0,(kj *)0x33958c,(char (*) [2])&local_7c,nextOrdinal);
  Text::Reader::Reader((Reader *)&local_b8,&local_d0);
  LocatedText::Builder::setValue(&local_a8,(Reader)local_b8);
  kj::String::~String(&local_d0);
  Declaration::Builder::getId((Builder *)&field._builder.dataSize,(Builder *)local_48);
  Declaration::Id::Builder::initOrdinal(&local_108,(Builder *)&field._builder.dataSize);
  LocatedInteger::Builder::setValue(&local_108,(ulong)local_7c);
  Declaration::Builder::initField((Builder *)&makeValue.impl.ptr,(Builder *)local_48);
  Declaration::Field::Builder::initType(&local_190,(Builder *)&makeValue.impl.ptr);
  type._builder.capTable = (CapTableBuilder *)local_190._builder.data;
  type._builder.segment = (SegmentBuilder *)local_190._builder.capTable;
  type._builder.data = local_190._builder.pointers;
  type._builder.pointers = (WirePointer *)local_190._builder._32_8_;
  type._builder._32_8_ = this;
  randomizeType(type);
  iVar3 = rand();
  if (iVar3 % 4 == 0) {
    Declaration::Field::Builder::getDefaultValue(&local_1e0,(Builder *)&makeValue.impl.ptr);
    Declaration::Field::DefaultValue::Builder::initValue(&local_1b8,&local_1e0);
    params._builder.capTable = local_1b8._builder.capTable;
    params._builder.segment = local_1b8._builder.segment;
    params._builder.data = local_1b8._builder.data;
    params._builder.pointers = local_1b8._builder.pointers;
    params._builder.dataSize = local_1b8._builder.dataSize;
    params._builder.pointerCount = local_1b8._builder.pointerCount;
    params._builder._38_2_ = local_1b8._builder._38_2_;
    kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::operator()
              ((ConstFunction<void_(capnp::compiler::Expression::Builder)> *)local_168,params);
  }
  else {
    Declaration::Field::Builder::getDefaultValue(&local_208,(Builder *)&makeValue.impl.ptr);
    Declaration::Field::DefaultValue::Builder::setNone(&local_208);
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_220,"Add field.");
  ChangeInfo::ChangeInfo(this,COMPATIBLE,(StringPtr)local_220);
  kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::~ConstFunction
            ((ConstFunction<void_(capnp::compiler::Expression::Builder)> *)local_168);
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo structAddField(Declaration::Builder decl, uint& nextOrdinal, bool scopeHasUnion) {
  auto fieldDecl = addNested(decl);

  uint ordinal = nextOrdinal++;

  fieldDecl.initName().setValue(kj::str("f", ordinal));
  fieldDecl.getId().initOrdinal().setValue(ordinal);

  auto field = fieldDecl.initField();

  auto makeValue = randomizeType(field.initType());
  if (rand() % 4 == 0) {
    makeValue(field.getDefaultValue().initValue());
  } else {
    field.getDefaultValue().setNone();
  }
  return { COMPATIBLE, "Add field." };
}